

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserInterface.cpp
# Opt level: O3

void __thiscall TextField::setString(TextField *this,string *s)

{
  int iVar1;
  Vector2f VVar2;
  locale alStack_68 [8];
  String local_60;
  string local_40;
  
  std::__cxx11::string::substr((ulong)&local_40,(ulong)s);
  std::locale::locale(alStack_68);
  sf::String::String(&local_60,&local_40,alStack_68);
  sf::Text::setString(&this->field,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)local_60.m_string._M_dataplus._M_p != &local_60.m_string.field_2) {
    operator_delete(local_60.m_string._M_dataplus._M_p);
  }
  std::locale::~locale(alStack_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  iVar1 = (int)s->_M_string_length;
  if (this->maxCharacters < iVar1) {
    iVar1 = this->maxCharacters;
  }
  this->caretPosition = iVar1;
  VVar2 = sf::Text::findCharacterPos(&this->field,(long)iVar1);
  sf::Transformable::setPosition(&(this->caret).super_Shape.super_Transformable,VVar2.x,2.0);
  return;
}

Assistant:

void TextField::setString(const string& s) {
    field.setString(s.substr(0, maxCharacters));
    caretPosition = min(maxCharacters, static_cast<int>(s.length()));
    caret.setPosition(field.findCharacterPos(caretPosition).x, 2.0f);
}